

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall
CTPNCodeBody::build_debug_table(CTPNCodeBody *this,ulong start_ofs,int include_lines)

{
  CTcPrsSymtab *pCVar1;
  ulong ofs;
  tcgen_line_t *ptVar2;
  CTcPrsSymtab *pCVar3;
  uint uVar4;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar5;
  void *extraout_RDX_05;
  uint val;
  CTcPrsSymtab **ppCVar6;
  uint uVar7;
  int iVar8;
  ulong n;
  long lVar9;
  ulong ofs_00;
  bool bVar10;
  write_local_to_debug_frame_ctx cbctx;
  undefined8 local_40;
  ulong local_38;
  
  val = 0;
  ppCVar6 = &G_cs->frame_head_;
  local_38 = start_ofs;
  while (pCVar1 = *ppCVar6, pCVar1 != (CTcPrsSymtab *)0x0) {
    local_40 = 1;
    CTcPrsSymtab::enum_entries(pCVar1,write_local_to_debug_frame,&local_40);
    uVar4 = val + 1;
    uVar7 = uVar4;
    if (local_40._4_4_ == 0) {
      uVar4 = 0;
      uVar7 = val;
    }
    val = uVar7;
    in_RCX = (size_t)val;
    pCVar1->list_index_ = uVar4;
    ppCVar6 = &pCVar1->list_next_;
  }
  if (include_lines != 0 || val != 0) {
    CTcDataStream::write2_at
              (&G_cs->super_CTcDataStream,local_38 + 8,
               (int)(G_cs->super_CTcDataStream).ofs_ - (int)local_38);
    pvVar5 = extraout_RDX;
    for (iVar8 = G_sizes.dbg_hdr; 0 < iVar8; iVar8 = iVar8 + -1) {
      CTcDataStream::write(&G_cs->super_CTcDataStream,0,pvVar5,in_RCX);
      pvVar5 = extraout_RDX_00;
    }
    CTcGenTarg::add_debug_line_table(G_cg,(G_cs->super_CTcDataStream).ofs_);
    if (include_lines == 0) {
      CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
    }
    else {
      CTcDataStream::write2(&G_cs->super_CTcDataStream,(uint)G_cs->line_cnt_);
      for (n = 0; n < G_cs->line_cnt_; n = n + 1) {
        ptVar2 = CTcCodeStream::get_line_rec(G_cs,n);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,ptVar2->ofs);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,ptVar2->source_id);
        CTcDataStream::write4(&G_cs->super_CTcDataStream,ptVar2->source_line);
        ppCVar6 = &ptVar2->frame;
        do {
          pCVar1 = *ppCVar6;
          if (pCVar1 == (CTcPrsSymtab *)0x0) {
            uVar7 = 0;
            break;
          }
          uVar7 = pCVar1->list_index_;
          ppCVar6 = &pCVar1->parent_;
        } while (uVar7 == 0);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,uVar7);
        pvVar5 = extraout_RDX_01;
        for (iVar8 = G_sizes.dbg_line + -10; 0 < iVar8; iVar8 = iVar8 + -1) {
          CTcDataStream::write(&G_cs->super_CTcDataStream,0,pvVar5,in_RCX);
          pvVar5 = extraout_RDX_02;
        }
      }
    }
    local_38 = (G_cs->super_CTcDataStream).ofs_;
    CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
    CTcDataStream::write2(&G_cs->super_CTcDataStream,val);
    ofs_00 = (G_cs->super_CTcDataStream).ofs_;
    lVar9 = (long)(int)val;
    while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
      CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
    }
    ppCVar6 = &G_cs->frame_head_;
    while (pCVar1 = *ppCVar6, pCVar1 != (CTcPrsSymtab *)0x0) {
      if (pCVar1->list_index_ != 0) {
        CTcDataStream::write2_at
                  (&G_cs->super_CTcDataStream,ofs_00,
                   (int)(G_cs->super_CTcDataStream).ofs_ - (int)ofs_00);
        ofs_00 = ofs_00 + 2;
        pCVar3 = pCVar1;
        do {
          pCVar3 = pCVar3->parent_;
          if (pCVar3 == (CTcPrsSymtab *)0x0) {
            uVar7 = 0;
            break;
          }
          uVar7 = pCVar3->list_index_;
        } while (uVar7 == 0);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,uVar7);
        ofs = (G_cs->super_CTcDataStream).ofs_;
        CTcDataStream::write2(&G_cs->super_CTcDataStream,0);
        pvVar5 = extraout_RDX_03;
        if (7 < G_sizes.dbg_frame) {
          CTcDataStream::write2(&G_cs->super_CTcDataStream,pCVar1->start_ofs_);
          CTcDataStream::write2(&G_cs->super_CTcDataStream,pCVar1->end_ofs_);
          pvVar5 = extraout_RDX_04;
        }
        for (iVar8 = G_sizes.dbg_frame + -8; 0 < iVar8; iVar8 = iVar8 + -1) {
          CTcDataStream::write(&G_cs->super_CTcDataStream,0,pvVar5,in_RCX);
          pvVar5 = extraout_RDX_05;
        }
        local_40 = 0;
        CTcPrsSymtab::enum_entries(pCVar1,write_local_to_debug_frame,&local_40);
        CTcDataStream::write2_at(&G_cs->super_CTcDataStream,ofs,local_40._4_4_);
      }
      ppCVar6 = &pCVar1->list_next_;
    }
    CTcDataStream::write2_at
              (&G_cs->super_CTcDataStream,local_38,
               (int)(G_cs->super_CTcDataStream).ofs_ - (int)local_38);
    CTcDataStream::write4(&G_cs->super_CTcDataStream,0);
  }
  return;
}

Assistant:

void CTPNCodeBody::build_debug_table(ulong start_ofs, int include_lines)
{
    size_t i;

    /*
     *   Count up the frames that contain local variables.  Frames that
     *   contain no locals can be elided to reduce the size of the file,
     *   since they carry no information.  
     */
    CTcPrsSymtab *frame;
    int frame_cnt;
    for (frame_cnt = 0, frame = G_cs->get_first_frame() ; frame != 0 ;
         frame = frame->get_list_next())
    {
        /* enumerate the entries through our counting callback */
        write_local_to_debug_frame_ctx cbctx;
        cbctx.count = 0;
        cbctx.count_only = TRUE;
        frame->enum_entries(&write_local_to_debug_frame, &cbctx);

        /* check to see if it has any locals */
        if (cbctx.count != 0)
        {
            /* it has locals - renumber it to the current list position */
            ++frame_cnt;
            frame->set_list_index(frame_cnt);
        }
        else
        {
            /* no locals - flag it as empty by setting its list index to 0 */
            frame->set_list_index(0);
        }
    }

    /*
     *   If we're not writing line records, and we don't have any frames with
     *   local variables, skip writing the debug table.  The debug table in
     *   this case is for local variable reflection information only, so if
     *   we don't have any locals, we don't need the table at all.  
     */
    if (!include_lines && frame_cnt == 0)
        return;

    /* fix up the debug record offset in the prolog to point here */
    G_cs->write2_at(start_ofs + 8, G_cs->get_ofs() - start_ofs);

    /*
     *   Write the debug table header.  In the current VM version, this is
     *   empty, so we have nothing to write.  However, if we're dynamically
     *   targeting a newer version, pad out any expected header space with
     *   zeros.  
     */
    for (int j = G_sizes.dbg_hdr ; j > 0 ; --j)
        G_cs->write(0);

    /* 
     *   Add this offset to our list of line records.  If we're creating an
     *   object file, upon re-loading the object file, we'll need to go
     *   through all of the line record tables and fix up the file references
     *   to the final file numbering system at link time, so we need this
     *   memory of where the line record are.  We'll also need to fix up the
     *   local variable name records to point to the consolidated set of
     *   strings in the constant pool.  
     */
    G_cg->add_debug_line_table(G_cs->get_ofs());

    /* if desired, write the source code location ("line") records */
    if (include_lines)
    {
        /* write the number of line records */
        G_cs->write2(G_cs->get_line_rec_count());

        /* write the line records themselves */
        for (i = 0 ; i < G_cs->get_line_rec_count() ; ++i)
        {
            /* get this record */
            tcgen_line_t *rec = G_cs->get_line_rec(i);

            /* write the offset of the statement's first opcode */
            G_cs->write2(rec->ofs);

            /* write the source file ID and line number */
            G_cs->write2(rec->source_id);
            G_cs->write4(rec->source_line);

            /* 
             *   Get the frame for the line record.  If the frame is empty,
             *   use the parent frame instead, since we omit empty frames.
             */
            CTcPrsSymtab *fr = rec->frame;
            while (fr != 0 && fr->get_list_index() == 0)
                fr = fr->get_parent();

            /* write the frame ID */
            G_cs->write2(fr == 0 ? 0 : fr->get_list_index());

            /* add any padding expected in the target VM version */
            for (int j = G_sizes.dbg_line - 10 ; j > 0 ; --j)
                G_cs->write(0);
        }
    }
    else
    {
        /* no line records - write zero as the line count */
        G_cs->write2(0);
    }

    /* 
     *   write a placeholder pointer to the next byte after the end of the
     *   frame table 
     */
    ulong post_ptr_ofs = G_cs->get_ofs();
    G_cs->write2(0);

    /* write the frame count */
    G_cs->write2(frame_cnt);

    /* 
     *   Write a placeholder frame index table.  We will come back and fix up
     *   this table as we actually write out the frames, but we don't
     *   actually know how big the individual frame records will be yet, so
     *   we can only write placeholders for them for now.  First, note where
     *   the frame index table begins.  
     */
    ulong index_ofs = G_cs->get_ofs();

    /* write the placeholder index entries */
    for (i = 0 ; i < (size_t)frame_cnt ; ++i)
        G_cs->write2(0);

    /* write the individual frames */
    for (frame = G_cs->get_first_frame() ; frame != 0 ;
         frame = frame->get_list_next())
    {
        /* 
         *   if this frame has a zero list index, it means that it contains
         *   no writable symbols, so we can omit it from the debug table 
         */
        if (frame->get_list_index() == 0)
            continue;

        /* 
         *   go back and fill in the correct offset (from the entry itself)
         *   in the index table entry for this frame 
         */
        G_cs->write2_at(index_ofs, G_cs->get_ofs() - index_ofs);

        /* move on to the next index entry */
        index_ofs += 2;

        /* 
         *   Get the effective parent.  If the actual parent doesn't have a
         *   list index, it's empty, so we're not writing it.  Find the
         *   nearest parent of the parent that we'll actually write, and use
         *   that as our effective parent. 
         */
        CTcPrsSymtab *par;
        for (par = frame->get_parent() ;
             par != 0 && par->get_list_index() == 0 ;
             par = par->get_parent()) ;

        /* write the ID of the enclosing frame */
        G_cs->write2(par != 0 ? par->get_list_index() : 0);

        /* 
         *   write a placeholder for the count of the number of entries in
         *   the frame, and remember where the placeholder is so we can come
         *   back and fix it up later 
         */
        ulong count_ofs = G_cs->get_ofs();
        G_cs->write2(0);

        /* add the bytecode range covered, if there's room in the format */
        if (G_sizes.dbg_frame >= 8)
        {
            G_cs->write2(frame->get_start_ofs());
            G_cs->write2(frame->get_end_ofs());
        }

        /* pad out any extra space */
        for (int j = G_sizes.dbg_frame - 8 ; j > 0 ; --j)
            G_cs->write(0);

        /* initialize the enumeration callback context */
        write_local_to_debug_frame_ctx cbctx;
        cbctx.count = 0;
        cbctx.count_only = FALSE;

        /* write this frame table's entries */
        frame->enum_entries(&write_local_to_debug_frame, &cbctx);

        /* go back and fix up the symbol count */
        G_cs->write2_at(count_ofs, cbctx.count);
    }

    /* 
     *   go back and fill in the post-pointer offset - this is a pointer to
     *   the next byte after the end of the frame table; write the offset
     *   from the post-pointer field to the current location 
     */
    G_cs->write2_at(post_ptr_ofs, G_cs->get_ofs() - post_ptr_ofs);

    /* 
     *   write the required UINT4 zero value after the frame table - this
     *   is a placeholder for future expansion (if we add more information
     *   to the debug table later, this value will be non-zero to indicate
     *   the presence of the additional information) 
     */
    G_cs->write4(0);
}